

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

ON_UUID ON_MeshCache::MeshIdFromMeshType(mesh_type mesh_type)

{
  undefined4 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  ON_UUID *pOVar4;
  uchar *puVar5;
  ON_UUID OVar6;
  
  if (mesh_type < (any_mesh|render_mesh)) {
    pOVar4 = (ON_UUID *)(&PTR_CoarseMeshId_00814008)[mesh_type];
    puVar5 = (&PTR_CoarseMeshId_Data4_0__00814030)[mesh_type];
  }
  else {
    pOVar4 = &ON_nil_uuid;
    puVar5 = ON_nil_uuid.Data4;
  }
  uVar1 = pOVar4->Data1;
  uVar2 = pOVar4->Data2;
  uVar3 = pOVar4->Data3;
  OVar6.Data3 = uVar3;
  OVar6.Data2 = uVar2;
  OVar6.Data1 = uVar1;
  OVar6.Data4 = *(uchar (*) [8])puVar5;
  return OVar6;
}

Assistant:

ON_UUID ON_MeshCache::MeshIdFromMeshType(
  ON::mesh_type mesh_type
  )
{
  switch (mesh_type)
  {
  case ON::default_mesh:
    return ON_MeshCache::CoarseMeshId;
    break;
  case ON::render_mesh:
    return ON_MeshCache::RenderMeshId;
    break;
  case ON::analysis_mesh:
    return ON_MeshCache::AnalysisMeshId;
    break;
  case ON::preview_mesh:
    return ON_MeshCache::PreviewMeshId;
    break;
  case ON::any_mesh:
    return ON_MeshCache::AnyMeshId;
    break;
  default:
    break;
  }

  return ON_nil_uuid;
}